

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

qint64 __thiscall QNetworkReplyHttpImpl::bytesAvailable(QNetworkReplyHttpImpl *this)

{
  bool bVar1;
  QNetworkReplyHttpImplPrivate *pQVar2;
  long lVar3;
  qint64 qVar4;
  QDecompressHelper *in_RDI;
  QNetworkReplyHttpImplPrivate *d;
  QDecompressHelper *in_stack_ffffffffffffffd0;
  long local_8;
  
  pQVar2 = d_func((QNetworkReplyHttpImpl *)0x31579c);
  if (pQVar2->cacheLoadDevice == (QIODevice *)0x0) {
    if (pQVar2->downloadZerocopyBuffer == (char *)0x0) {
      bVar1 = QDecompressHelper::isValid(&pQVar2->decompressHelper);
      if (bVar1) {
        bVar1 = QDecompressHelper::isCountingBytes(&pQVar2->decompressHelper);
        if (bVar1) {
          lVar3 = QIODevice::bytesAvailable();
          qVar4 = QDecompressHelper::uncompressedSize(in_RDI);
          return lVar3 + qVar4;
        }
        bVar1 = QDecompressHelper::hasData(in_stack_ffffffffffffffd0);
        if (bVar1) {
          lVar3 = QIODevice::bytesAvailable();
          return lVar3 + 1;
        }
      }
      local_8 = QIODevice::bytesAvailable();
    }
    else {
      lVar3 = QIODevice::bytesAvailable();
      local_8 = (lVar3 + pQVar2->downloadBufferCurrentSize) - pQVar2->downloadBufferReadPosition;
    }
  }
  else {
    local_8 = QIODevice::bytesAvailable();
    lVar3 = (**(code **)(*(long *)pQVar2->cacheLoadDevice + 0xa0))();
    local_8 = local_8 + lVar3;
  }
  return local_8;
}

Assistant:

qint64 QNetworkReplyHttpImpl::bytesAvailable() const
{
    Q_D(const QNetworkReplyHttpImpl);

    // if we load from cache device
    if (d->cacheLoadDevice) {
        return QNetworkReply::bytesAvailable() + d->cacheLoadDevice->bytesAvailable();
    }

    // zerocopy buffer
    if (d->downloadZerocopyBuffer) {
        return QNetworkReply::bytesAvailable() + d->downloadBufferCurrentSize - d->downloadBufferReadPosition;
    }

    if (d->decompressHelper.isValid()) {
        if (d->decompressHelper.isCountingBytes())
            return QNetworkReply::bytesAvailable() + d->decompressHelper.uncompressedSize();
        if (d->decompressHelper.hasData())
            return QNetworkReply::bytesAvailable() + 1;
    }

    // normal buffer
    return QNetworkReply::bytesAvailable();
}